

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerReflection::emit_type_member_qualifiers
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  Decoration *pDVar1;
  Stream *pSVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  uint64_t uVar7;
  ulong uVar8;
  string local_58;
  SPIRType *local_38;
  
  uVar8 = (ulong)index;
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar8].id);
  emit_type_array(this,pSVar5);
  pmVar6 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  if (uVar8 < (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    pDVar1 = (pmVar6->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    uVar7 = pDVar1[uVar8].decoration_flags.lower;
    local_38 = pSVar5;
    if (((uint)uVar7 >> 0x1e & 1) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"location","");
      uVar4 = pDVar1[uVar8].location;
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar7 = pDVar1[uVar8].decoration_flags.lower;
    }
    if ((uVar7 >> 0x23 & 1) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"offset","");
      uVar4 = pDVar1[uVar8].offset;
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    bVar3 = Compiler::has_decoration
                      ((Compiler *)this,
                       (ID)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar8]
                           .id,DecorationArrayStride);
    if (bVar3) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"array_stride","");
      uVar4 = Compiler::get_decoration
                        ((Compiler *)this,
                         (ID)(type->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar8].id,DecorationArrayStride);
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    uVar7 = pDVar1[uVar8].decoration_flags.lower;
    if ((char)uVar7 < '\0') {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"matrix_stride","");
      uVar4 = pDVar1[uVar8].matrix_stride;
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      uVar7 = pDVar1[uVar8].decoration_flags.lower;
    }
    pSVar5 = local_38;
    if ((uVar7 & 0x10) != 0) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"row_major","");
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
    bVar3 = Compiler::type_is_top_level_physical_pointer((Compiler *)this,pSVar5);
    if (bVar3) {
      pSVar2 = (this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"physical_pointer","");
      simple_json::Stream::emit_json_key(pSVar2,&local_58);
      StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void CompilerReflection::emit_type_member_qualifiers(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	emit_type_array(membertype);
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
	{
		auto &dec = memb[index];
		if (dec.decoration_flags.get(DecorationLocation))
			json_stream->emit_json_key_value("location", dec.location);
		if (dec.decoration_flags.get(DecorationOffset))
			json_stream->emit_json_key_value("offset", dec.offset);

		// Array stride is a property of the array type, not the struct.
		if (has_decoration(type.member_types[index], DecorationArrayStride))
			json_stream->emit_json_key_value("array_stride",
			                                 get_decoration(type.member_types[index], DecorationArrayStride));

		if (dec.decoration_flags.get(DecorationMatrixStride))
			json_stream->emit_json_key_value("matrix_stride", dec.matrix_stride);
		if (dec.decoration_flags.get(DecorationRowMajor))
			json_stream->emit_json_key_value("row_major", true);

		if (type_is_top_level_physical_pointer(membertype))
			json_stream->emit_json_key_value("physical_pointer", true);
	}
}